

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O0

void __thiscall
basisu::vector<basisu::image_stats>::vector
          (vector<basisu::image_stats> *this,vector<basisu::image_stats> *other)

{
  long in_RSI;
  image_stats *in_RDI;
  uint32_t i;
  image_stats *pSrc;
  image_stats *pDst;
  undefined2 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffca;
  undefined1 in_stack_ffffffffffffffcb;
  uint32_t in_stack_ffffffffffffffcc;
  uint32_t local_24;
  
  *(image_stats **)&in_RDI->m_filename = (image_stats *)0x0;
  *(uint32_t *)&(in_RDI->m_filename)._M_string_length = 0;
  *(uint32_t *)((long)&(in_RDI->m_filename)._M_string_length + 4) = 0;
  increase_capacity((vector<basisu::image_stats> *)in_RDI,in_stack_ffffffffffffffcc,
                    (bool)in_stack_ffffffffffffffcb,(bool)in_stack_ffffffffffffffca);
  *(uint32_t *)&(in_RDI->m_filename)._M_string_length = *(uint32_t *)(in_RSI + 8);
  for (local_24 = (uint32_t)(in_RDI->m_filename)._M_string_length; local_24 != 0;
      local_24 = local_24 - 1) {
    construct<basisu::image_stats,basisu::image_stats>
              (in_RDI,(image_stats *)
                      CONCAT44(in_stack_ffffffffffffffcc,
                               CONCAT13(in_stack_ffffffffffffffcb,
                                        CONCAT12(in_stack_ffffffffffffffca,in_stack_ffffffffffffffc8
                                                ))));
  }
  return;
}

Assistant:

inline vector(const vector& other) :
         m_p(NULL),
         m_size(0),
         m_capacity(0)
      {
         increase_capacity(other.m_size, false);

         m_size = other.m_size;

         if (BASISU_IS_BITWISE_COPYABLE(T))
         {
             if ((m_p) && (other.m_p))
                memcpy(m_p, other.m_p, m_size * sizeof(T));
         }
         else
         {
            T* pDst = m_p;
            const T* pSrc = other.m_p;
            for (uint32_t i = m_size; i > 0; i--)
               construct(pDst++, *pSrc++);
         }
      }